

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::PricingSession::Unsubscribe(PricingSession *this,Subject *subject)

{
  element_type *this_00;
  string local_38;
  Subject *local_18;
  Subject *subject_local;
  PricingSession *this_local;
  
  local_18 = subject;
  subject_local = (Subject *)this;
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)Log);
  price::subject::Subject::ToString_abi_cxx11_(&local_38,local_18);
  spdlog::logger::info<std::__cxx11::string>(this_00,"unsubscribing from {}",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
  ::erase(&this->subscriptions_,local_18);
  (*(this->pixie_provider_->super_Subscriber)._vptr_Subscriber[2])(this->pixie_provider_,local_18);
  return;
}

Assistant:

void PricingSession::Unsubscribe(Subject& subject)
{
    Log->info("unsubscribing from {}", subject.ToString());
    subscriptions_.erase(subject);
    pixie_provider_->Unsubscribe(subject);
}